

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeutils.cc
# Opt level: O3

int64_t rtc::TmToSeconds(tm *tm)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int64_t iVar6;
  bool bVar7;
  
  uVar2 = tm->tm_year;
  uVar1 = uVar2 + 0x76c;
  uVar3 = tm->tm_mon;
  iVar4 = tm->tm_mday;
  if ((uVar2 & 3) == 0) {
    uVar5 = uVar1 * -0x3d70a3d7 + 0x51eb850;
    bVar7 = true;
    if ((uVar5 >> 2 | uVar2 * 0x40000000) < 0x28f5c29) {
      bVar7 = (uVar5 >> 4 | uVar1 * -0x70000000) < 0xa3d70b;
    }
  }
  else {
    bVar7 = false;
  }
  iVar6 = -1;
  if ((0 < iVar4 && 0x45 < (int)uVar2) && uVar3 < 0xc) {
    if (((uint)tm->tm_sec < 0x3c && ((uint)tm->tm_min < 0x3c && (uint)tm->tm_hour < 0x18)) &&
        iVar4 <= (int)((uint)(byte)(uVar3 == 1 & bVar7) + (int)TmToSeconds::mdays[uVar3])) {
      iVar6 = (((ulong)(uint)tm->tm_hour +
               ((ulong)(uVar2 - 0x46) * 0x16d + (long)TmToSeconds::cumul_mdays[uVar3] +
               (long)(int)(((uVar1 / 400 + iVar4 + ((uVar1 >> 2) - uVar1 / 100)) -
                           (uint)(byte)(bVar7 & uVar3 < 2)) + -0x1de)) * 0x18) * 0x3c +
              (ulong)(uint)tm->tm_min) * 0x3c + (ulong)(uint)tm->tm_sec;
    }
  }
  return iVar6;
}

Assistant:

int64_t TmToSeconds(const std::tm& tm) {
  static short int mdays[12] = {31, 28, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31};
  static short int cumul_mdays[12] = {0,   31,  59,  90,  120, 151,
                                      181, 212, 243, 273, 304, 334};
  int year = tm.tm_year + 1900;
  int month = tm.tm_mon;
  int day = tm.tm_mday - 1;  // Make 0-based like the rest.
  int hour = tm.tm_hour;
  int min = tm.tm_min;
  int sec = tm.tm_sec;

  bool expiry_in_leap_year = (year % 4 == 0 &&
                              (year % 100 != 0 || year % 400 == 0));

  if (year < 1970)
    return -1;
  if (month < 0 || month > 11)
    return -1;
  if (day < 0 || day >= mdays[month] + (expiry_in_leap_year && month == 2 - 1))
    return -1;
  if (hour < 0 || hour > 23)
    return -1;
  if (min < 0 || min > 59)
    return -1;
  if (sec < 0 || sec > 59)
    return -1;

  day += cumul_mdays[month];

  // Add number of leap days between 1970 and the expiration year, inclusive.
  day += ((year / 4 - 1970 / 4) - (year / 100 - 1970 / 100) +
          (year / 400 - 1970 / 400));

  // We will have added one day too much above if expiration is during a leap
  // year, and expiration is in January or February.
  if (expiry_in_leap_year && month <= 2 - 1) // |month| is zero based.
    day -= 1;

  // Combine all variables into seconds from 1970-01-01 00:00 (except |month|
  // which was accumulated into |day| above).
  return (((static_cast<int64_t>
            (year - 1970) * 365 + day) * 24 + hour) * 60 + min) * 60 + sec;
}